

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
            *this,tuple<Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                  *v)

{
  type_by_index_t<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  *v_00;
  type_by_index_t<1UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  *v_01;
  tuple<Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  *v_local;
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  *this_local;
  
  v_00 = get<0ul,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
                   (v);
  tuple_value<0ul,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<0ul,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,false> *)this,v_00
            );
  v_01 = get<1ul,Fixpp::Field<Fixpp::TagT<458u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>>
                   (v);
  tuple_value<1ul,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<1ul,Fixpp::Field<Fixpp::TagT<459u,Fixpp::Type::String>>,false> *)
             (this + 0x28),v_01);
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( tuple< Us... >&& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, Us&& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( std::move( v ) ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( std::move( v ) ) ), true )..., true };
#endif
        return *this;
      }